

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_opcode_ss(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uStack_c0;
  char local_b8 [8];
  char src0 [64];
  char src1 [64];
  
  uStack_c0 = 0x11aa40;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args,local_b8,0x40);
  uStack_c0 = 0x11aa59;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args + 1,src0 + 0x38,0x40);
  uStack_c0 = 0x11aa61;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x11aa7d;
  lowercase(local_b8 + lVar1,opcode);
  pcVar3 = "+";
  if (ctx->coissue == 0) {
    pcVar3 = "";
  }
  *(undefined8 *)((long)&uStack_c0 + lVar1) = 0x11aab1;
  output_line(ctx,"%s%s %s, %s",pcVar3,local_b8 + lVar1,local_b8,src0 + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_ss(Context *ctx, const char *opcode)
{
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s %s, %s", ctx->coissue ? "+" : "", opcode, src0, src1);
}